

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utColladaExportLight.cpp
# Opt level: O2

void __thiscall
ColladaExportLight_testExportLight_Test::TestBody(ColladaExportLight_testExportLight_Test *this)

{
  aiLight *paVar1;
  unique_ptr<aiLight[],_std::default_delete<aiLight[]>_> uVar2;
  aiReturn aVar3;
  aiScene *paVar4;
  ColladaExportLight_testExportLight_Test *pCVar5;
  ulong uVar6;
  long lVar7;
  char *message;
  char *pcVar8;
  char *in_R9;
  __uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_> this_00;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff54;
  AssertionResult gtest_ar;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  AssertionResult gtest_ar__2;
  unique_ptr<aiLight[],_std::default_delete<aiLight[]>_> origLights;
  AssertHelper local_70;
  uint origNumLights;
  ColladaExportLight_testExportLight_Test *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  origNames;
  
  paVar4 = Assimp::Importer::ReadFile
                     ((this->super_ColladaExportLight).im,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/Collada/lights.dae"
                      ,0x400);
  origNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  origNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(origNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,paVar4 != (aiScene *)0x0);
  if (paVar4 == (aiScene *)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&origNames,(AssertionResult *)"pTest!=NULL","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&origLights,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
               ,0x4e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&origLights,(Message *)&gtest_ar__2);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&origNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    bVar10 = paVar4->mLights != (aiLight **)0x0;
    bVar11 = paVar4->mNumLights != 0;
    origNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(origNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar11 && bVar10);
    origNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (bVar11 && bVar10) {
      local_60 = this;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&origNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      origNumLights = paVar4->mNumLights;
      uVar6 = (ulong)origNumLights;
      uVar9 = uVar6 * 0x46c;
      origLights._M_t.super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>._M_t.
      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
      super__Head_base<0UL,_aiLight_*,_false>._M_head_impl =
           (__uniq_ptr_data<aiLight,_std::default_delete<aiLight[]>,_true,_true>)
           operator_new__(uVar9);
      this_00._M_t.super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
      super__Head_base<0UL,_aiLight_*,_false>._M_head_impl =
           (tuple<aiLight_*,_std::default_delete<aiLight[]>_>)
           (tuple<aiLight_*,_std::default_delete<aiLight[]>_>)
           origLights._M_t.super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>._M_t.
           super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
           super__Head_base<0UL,_aiLight_*,_false>._M_head_impl;
      while (uVar6 != 0) {
        aiLight::aiLight((aiLight *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
                         super__Head_base<0UL,_aiLight_*,_false>._M_head_impl);
        this_00._M_t.super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
        super__Head_base<0UL,_aiLight_*,_false>._M_head_impl =
             (tuple<aiLight_*,_std::default_delete<aiLight[]>_>)
             ((long)this_00._M_t.super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
                    super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x46c);
        uVar9 = uVar9 - 0x46c;
        uVar6 = uVar9;
      }
      origNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      origNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      origNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar7 = 0;
      for (uVar9 = 0; pCVar5 = local_60, uVar9 < origNumLights; uVar9 = uVar9 + 1) {
        std::__cxx11::string::string
                  ((string *)&gtest_ar,(paVar4->mLights[uVar9]->mName).data,
                   (allocator *)&gtest_ar__2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&origNames,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
        std::__cxx11::string::~string((string *)&gtest_ar);
        aiLight::operator=((aiLight *)
                           ((long)origLights._M_t.
                                  super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                  .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + lVar7),
                           paVar4->mLights[uVar9]);
        lVar7 = lVar7 + 0x46c;
      }
      gtest_ar__2.success_ = false;
      gtest_ar__2._1_3_ = 0;
      pcVar8 = (char *)0x0;
      Assimp::Exporter::Export
                ((local_60->super_ColladaExportLight).ex,paVar4,"collada","lightsExp.dae",0,
                 (ExportProperties *)0x0);
      testing::internal::CmpHelperEQ<aiReturn,aiReturn>
                ((internal *)&gtest_ar,"aiReturn_SUCCESS","ex->Export(pTest,\"collada\",file)",
                 (aiReturn *)&gtest_ar__2,(aiReturn *)&stack0xffffffffffffff50);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                   ,0x59,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__2);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      paVar4 = Assimp::Importer::ReadFile
                         ((pCVar5->super_ColladaExportLight).im,"lightsExp.dae",0x400);
      gtest_ar__2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      bVar10 = paVar4 != (aiScene *)0x0;
      gtest_ar__2.success_ = bVar10;
      if (paVar4 == (aiScene *)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)"imported!=NULL",
                   "false","true",pcVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                   ,0x5d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&stack0xffffffffffffff50);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&stack0xffffffffffffff50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__2.message_);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__2.message_);
        bVar10 = paVar4->mLights != (aiLight **)0x0;
        bVar11 = paVar4->mNumLights != 0;
        gtest_ar__2.success_ = bVar11 && bVar10;
        gtest_ar__2.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar11 || !bVar10) {
          testing::Message::Message((Message *)&stack0xffffffffffffff50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__2,
                     (AssertionResult *)"imported->HasLights()","false","true",pcVar8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                     ,0x5f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&stack0xffffffffffffff50);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          std::__cxx11::string::~string((string *)&gtest_ar);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xffffffffffffff50);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__2.message_);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_ar,"origNumLights","imported->mNumLights",&origNumLights,
                   &paVar4->mNumLights);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__2);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                     ,0x60,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__2);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        pCVar5 = (ColladaExportLight_testExportLight_Test *)0x8;
        lVar7 = 0x404;
        for (uVar9 = 0;
            uVar2._M_t.super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>._M_t.
            super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
            super__Head_base<0UL,_aiLight_*,_false>._M_head_impl =
                 origLights._M_t.super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>.
                 _M_t.super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
                 super__Head_base<0UL,_aiLight_*,_false>._M_head_impl, uVar9 < origNumLights;
            uVar9 = uVar9 + 1) {
          paVar1 = paVar4->mLights[uVar9];
          gtest_ar__2.success_ = false;
          gtest_ar__2._1_3_ = 0;
          local_60 = pCVar5;
          aVar3 = strncmp(*(char **)(origNames.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].field_2.
                                     _M_local_buf + 8 + (long)pCVar5),(paVar1->mName).data,
                          *(size_t *)
                           ((long)&((origNames.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           (long)&(pCVar5->super_ColladaExportLight).super_Test));
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"0",
                     "strncmp(origNames[ i ].c_str(),read->mName.C_Str(), origNames[ i ].size() )",
                     (int *)&gtest_ar__2,(int *)&stack0xffffffffffffff50);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,100,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                    ((internal *)&gtest_ar,"orig->mType","read->mType",
                     (aiLightSourceType *)
                     ((long)uVar2._M_t.
                            super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>._M_t.
                            super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
                            super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + lVar7),
                     &paVar1->mType);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x65,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mAttenuationConstant","read->mAttenuationConstant"
                     ,*(float *)((long)uVar2._M_t.
                                       super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                       .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x28
                                + lVar7),paVar1->mAttenuationConstant);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x66,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mAttenuationLinear","read->mAttenuationLinear",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x2c +
                               lVar7),paVar1->mAttenuationLinear);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x67,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff54,aVar3),in_stack_ffffffffffffff48,
                     (char *)0x38069b,(double)in_stack_ffffffffffffff70,
                     (double)in_stack_ffffffffffffff68,(double)gtest_ar.message_.ptr_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x68,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorAmbient.r","read->mColorAmbient.r",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x4c +
                               lVar7),(paVar1->mColorAmbient).r);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6a,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorAmbient.g","read->mColorAmbient.g",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x50 +
                               lVar7),(paVar1->mColorAmbient).g);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6b,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorAmbient.b","read->mColorAmbient.b",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x54 +
                               lVar7),(paVar1->mColorAmbient).b);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6c,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorDiffuse.r","read->mColorDiffuse.r",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x34 +
                               lVar7),(paVar1->mColorDiffuse).r);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6e,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorDiffuse.g","read->mColorDiffuse.g",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x38 +
                               lVar7),(paVar1->mColorDiffuse).g);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6f,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorDiffuse.b","read->mColorDiffuse.b",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x3c +
                               lVar7),(paVar1->mColorDiffuse).b);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x70,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorSpecular.r","read->mColorSpecular.r",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x40 +
                               lVar7),(paVar1->mColorSpecular).r);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x72,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorSpecular.g","read->mColorSpecular.g",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x44 +
                               lVar7),(paVar1->mColorSpecular).g);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x73,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"orig->mColorSpecular.b","read->mColorSpecular.b",
                     *(float *)((long)uVar2._M_t.
                                      super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                      .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 0x48 +
                               lVar7),(paVar1->mColorSpecular).b);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x74,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff54,aVar3),in_stack_ffffffffffffff48,
                     (char *)0x380bbe,(double)in_stack_ffffffffffffff70,
                     (double)in_stack_ffffffffffffff68,(double)gtest_ar.message_.ptr_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x76,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::DoubleNearPredFormat
                    ((char *)CONCAT44(in_stack_ffffffffffffff54,aVar3),in_stack_ffffffffffffff48,
                     (char *)0x380c4f,(double)in_stack_ffffffffffffff70,
                     (double)in_stack_ffffffffffffff68,(double)gtest_ar.message_.ptr_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            pcVar8 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x77,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__2);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          pCVar5 = local_60 + 1;
          lVar7 = lVar7 + 0x46c;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&origNames);
      std::unique_ptr<aiLight[],_std::default_delete<aiLight[]>_>::~unique_ptr(&origLights);
      return;
    }
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&origNames,(AssertionResult *)"pTest->HasLights()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&origLights,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
               ,0x4f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&origLights,(Message *)&gtest_ar__2);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&origLights);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar__2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&origNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST_F(ColladaExportLight, testExportLight)
{
    const char* file = "lightsExp.dae";

    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/Collada/lights.dae", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest!=NULL);
    ASSERT_TRUE(pTest->HasLights());

    const unsigned int origNumLights( pTest->mNumLights );
    std::unique_ptr<aiLight[]> origLights( new aiLight[ origNumLights ] );
    std::vector<std::string> origNames;
    for (size_t i = 0; i < origNumLights; i++) {
        origNames.push_back( pTest->mLights[ i ]->mName.C_Str() );
        origLights[ i ] = *(pTest->mLights[ i ]);
    }

    EXPECT_EQ(AI_SUCCESS,ex->Export(pTest,"collada",file));

    const aiScene* imported = im->ReadFile(file, aiProcess_ValidateDataStructure);

    ASSERT_TRUE(imported!=NULL);

    EXPECT_TRUE(imported->HasLights());
    EXPECT_EQ( origNumLights,imported->mNumLights );
    for(size_t i=0; i< origNumLights; i++) {
        const aiLight *orig = &origLights[ i ];
        const aiLight *read = imported->mLights[i];
        EXPECT_EQ( 0,strncmp(origNames[ i ].c_str(),read->mName.C_Str(), origNames[ i ].size() ) );
        EXPECT_EQ( orig->mType,read->mType);
        EXPECT_FLOAT_EQ(orig->mAttenuationConstant,read->mAttenuationConstant);
        EXPECT_FLOAT_EQ(orig->mAttenuationLinear,read->mAttenuationLinear);
        EXPECT_NEAR(orig->mAttenuationQuadratic,read->mAttenuationQuadratic, 0.001f);

        EXPECT_FLOAT_EQ(orig->mColorAmbient.r,read->mColorAmbient.r);
        EXPECT_FLOAT_EQ(orig->mColorAmbient.g,read->mColorAmbient.g);
        EXPECT_FLOAT_EQ(orig->mColorAmbient.b,read->mColorAmbient.b);

        EXPECT_FLOAT_EQ(orig->mColorDiffuse.r,read->mColorDiffuse.r);
        EXPECT_FLOAT_EQ(orig->mColorDiffuse.g,read->mColorDiffuse.g);
        EXPECT_FLOAT_EQ(orig->mColorDiffuse.b,read->mColorDiffuse.b);

        EXPECT_FLOAT_EQ(orig->mColorSpecular.r,read->mColorSpecular.r);
        EXPECT_FLOAT_EQ(orig->mColorSpecular.g,read->mColorSpecular.g);
        EXPECT_FLOAT_EQ(orig->mColorSpecular.b,read->mColorSpecular.b);

        EXPECT_NEAR(orig->mAngleInnerCone,read->mAngleInnerCone,0.001);
        EXPECT_NEAR(orig->mAngleOuterCone,read->mAngleOuterCone,0.001);
    }
}